

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Serializer::BreakdownVarName
          (BP5Serializer *this,char *Name,char **base_name_p,int *type_p,int *element_size_p)

{
  char *pcVar1;
  undefined4 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined4 *in_R8;
  char *NameStart;
  int ElementSize;
  int Type;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined8 *local_18;
  char *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pcVar1 = strchr(in_RSI,0x5f);
  pcVar1 = strchr(pcVar1 + 1,0x5f);
  __isoc99_sscanf(local_10 + 3,"%d_%d_",&local_30,&local_2c);
  *local_28 = local_30;
  *local_20 = local_2c;
  pcVar1 = strdup(pcVar1 + 1);
  *local_18 = pcVar1;
  return;
}

Assistant:

void BP5Serializer::BreakdownVarName(const char *Name, char **base_name_p, int *type_p,
                                     int *element_size_p)
{
    int Type;
    int ElementSize;
    const char *NameStart = strchr(strchr(Name, '_') + 1, '_') + 1;
    sscanf(Name + 3, "%d_%d_", &ElementSize, &Type);
    *element_size_p = ElementSize;
    *type_p = Type;
    *base_name_p = strdup(NameStart);
}